

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::java::JavaPackageToDir
                   (string *__return_storage_ptr__,string *package_name)

{
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,".",&local_51);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/",&local_52);
  StringReplace(__return_storage_ptr__,package_name,&local_30,&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (__return_storage_ptr__->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string JavaPackageToDir(string package_name) {
  string package_dir =
    StringReplace(package_name, ".", "/", true);
  if (!package_dir.empty()) package_dir += "/";
  return package_dir;
}